

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_service.hpp
# Opt level: O2

void __thiscall
asio::detail::reactive_socket_service<asio::ip::udp>::reactive_socket_service
          (reactive_socket_service<asio::ip::udp> *this,execution_context *context)

{
  (this->super_execution_context_service_base<asio::detail::reactive_socket_service<asio::ip::udp>_>
  ).super_service.key_.type_info_ = (type_info *)0x0;
  (this->super_execution_context_service_base<asio::detail::reactive_socket_service<asio::ip::udp>_>
  ).super_service.key_.id_ = (id *)0x0;
  (this->super_execution_context_service_base<asio::detail::reactive_socket_service<asio::ip::udp>_>
  ).super_service.owner_ = context;
  (this->super_execution_context_service_base<asio::detail::reactive_socket_service<asio::ip::udp>_>
  ).super_service.next_ = (service *)0x0;
  (this->super_execution_context_service_base<asio::detail::reactive_socket_service<asio::ip::udp>_>
  ).super_service._vptr_service = (_func_int **)&PTR__noncopyable_00450168;
  reactive_socket_service_base::reactive_socket_service_base
            (&this->super_reactive_socket_service_base,context);
  (this->super_execution_context_service_base<asio::detail::reactive_socket_service<asio::ip::udp>_>
  ).super_service._vptr_service = (_func_int **)&PTR__noncopyable_004500a0;
  return;
}

Assistant:

reactive_socket_service(execution_context& context)
    : execution_context_service_base<
        reactive_socket_service<Protocol>>(context),
      reactive_socket_service_base(context)
  {
  }